

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vivify.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::vivify_chain_for_units(Internal *this,int lit,Clause *reason)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  unsigned_long in_RAX;
  uint uVar4;
  Clause *__range1;
  long lVar5;
  uint64_t id;
  unsigned_long local_38;
  
  if ((this->lrat == true) && (this->level == 0)) {
    iVar1 = reason->size;
    local_38 = in_RAX;
    for (lVar5 = 0; (long)iVar1 * 4 != lVar5; lVar5 = lVar5 + 4) {
      iVar2 = *(int *)((long)&reason[1].field_0 + lVar5);
      if (iVar2 != lit) {
        uVar4 = this->vals[iVar2] * iVar2;
        uVar3 = -uVar4;
        if (0 < (int)uVar4) {
          uVar3 = uVar4;
        }
        local_38 = (this->unit_clauses_idx).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)(uVar3 << 1 | uVar4 >> 0x1f)];
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->lrat_chain,&local_38);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->lrat_chain,(value_type_conflict5 *)reason);
  }
  return;
}

Assistant:

inline void Internal::vivify_chain_for_units (int lit, Clause *reason) {
  if (!lrat)
    return;
  // LOG ("building chain for units");        bad line for debugging
  // equivalence if (opts.chrono && assignment_level (lit, reason)) return;
  if (level)
    return; // not decision level 0
  assert (lrat_chain.empty ());
  for (auto &reason_lit : *reason) {
    if (lit == reason_lit)
      continue;
    assert (val (reason_lit));
    const unsigned uidx = vlit (val (reason_lit) * reason_lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (reason->id);
}